

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemma_name_reader.cc
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* uttamarin::ReadLemmaNamesFromSpthyFile
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *spthy_file_path)

{
  bool bVar1;
  istream *piVar2;
  long lVar3;
  string line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  string local_278;
  string tamarin_command;
  ifstream tamarin_stream;
  
  std::operator+(&local_298,"tamarin-prover ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 spthy_file_path);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&line,
                 &local_298," 1> ");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &tamarin_stream,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&line,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &kTamarinTempfilePath_abi_cxx11_);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &tamarin_command,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &tamarin_stream," 2> /dev/null");
  std::__cxx11::string::~string((string *)&tamarin_stream);
  std::__cxx11::string::~string((string *)&line);
  std::__cxx11::string::~string((string *)&local_298);
  ExecuteShellCommand(&tamarin_command);
  std::ifstream::ifstream(&tamarin_stream,(string *)&kTamarinTempfilePath_abi_cxx11_,_S_in);
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  line.field_2._M_local_buf[0] = '\0';
  do {
    do {
      piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&tamarin_stream,(string *)&line);
      if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) goto LAB_0011bd10;
    } while (line._M_string_length < 5);
    std::__cxx11::string::substr((ulong)&local_298,(ulong)&line);
    bVar1 = std::operator!=(&local_298,"=====");
    std::__cxx11::string::~string((string *)&local_298);
  } while (bVar1);
LAB_0011bd10:
  do {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&tamarin_stream,(string *)&line);
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) {
LAB_0011bd34:
      remove(kTamarinTempfilePath_abi_cxx11_);
      std::__cxx11::string::~string((string *)&line);
      std::ifstream::~ifstream(&tamarin_stream);
      std::__cxx11::string::~string((string *)&tamarin_command);
      return __return_storage_ptr__;
    }
    if (4 < line._M_string_length) {
      std::__cxx11::string::substr((ulong)&local_298,(ulong)&line);
      bVar1 = std::operator==(&local_298,"=====");
      std::__cxx11::string::~string((string *)&local_298);
      if (bVar1) goto LAB_0011bd34;
    }
    lVar3 = std::__cxx11::string::find((char *)&line,0x12aac9);
    if (lVar3 != -1) {
      std::__cxx11::string::string((string *)&local_278,(string *)&line);
      ExtractLemmaName((string *)&local_298,&local_278);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,&local_298);
      std::__cxx11::string::~string((string *)&local_298);
      std::__cxx11::string::~string((string *)&local_278);
    }
  } while( true );
}

Assistant:

vector<string> ReadLemmaNamesFromSpthyFile(const string& spthy_file_path) {
  string tamarin_command = "tamarin-prover "  + spthy_file_path + 
    " 1> " + kTamarinTempfilePath + " 2> /dev/null";
  ExecuteShellCommand(tamarin_command);

  std::ifstream tamarin_stream {kTamarinTempfilePath, std::ifstream::in};
  vector<string> lemma_names;
  string line;

  // Move stream to begin of lemma name section
  while(std::getline(tamarin_stream, line) && 
        (line.size() < 5 || line.substr(0,5) != "====="));

  // Read lemma names
  while(std::getline(tamarin_stream, line) && 
      !(line.size() >= 5 && line.substr(0,5) == "=====")) {
      if(line.find("steps)") == std::string::npos) continue;
    lemma_names.push_back(ExtractLemmaName(line));
  }

  // Remove temp file
  std::remove(kTamarinTempfilePath.c_str());

  return lemma_names;
}